

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O1

void Cec_ManPatVerifyPattern(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  
  Gia_ManIncrementTravId(p);
  if (0 < vPat->nSize) {
    lVar3 = 0;
    do {
      if (vPat->pArray[lVar3] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      uVar4 = (uint)vPat->pArray[lVar3] >> 1;
      if (p->vCis->nSize <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCis->pArray[uVar4];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs + iVar5;
      *(ulong *)pGVar1 =
           (*(ulong *)pGVar1 >> 0x20 & 0x40000000 | *(ulong *)pGVar1 & 0xffffffffbfffffff) ^
           0x40000000;
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar5 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar5) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x227,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      p->pTravIds[iVar5] = p->nTravIds;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vPat->nSize);
  }
  iVar5 = Cec_ManPatComputePattern3_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
  if ((iVar5 != 3) && (((*(uint *)pObj >> 0x1d & 1) != 0) + 1 != iVar5)) {
    return;
  }
  Abc_Print((int)p,"Cec_ManPatVerifyPattern(): Verification failed.\n");
  __assert_fail("Value == GIA_ONE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                ,0x12f,"void Cec_ManPatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Cec_ManPatVerifyPattern( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    Gia_Obj_t * pTemp;
    int i, Value;
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vPat, Value, i )
    {
        pTemp = Gia_ManCi( p, Abc_Lit2Var(Value) );
//        assert( Abc_LitIsCompl(Value) != (int)pTemp->fMark1 );
        if ( pTemp->fMark1 )
        {
            pTemp->fMark0 = 0;
            pTemp->fMark1 = 1;
        }
        else
        {
            pTemp->fMark0 = 1;
            pTemp->fMark1 = 0;
        }
        Gia_ObjSetTravIdCurrent( p, pTemp );
    }
    Value = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin0(pObj) );
    Value = Gia_XsimNotCond( Value, Gia_ObjFaninC0(pObj) );
    if ( Value != GIA_ONE )
        Abc_Print( 1, "Cec_ManPatVerifyPattern(): Verification failed.\n" );
    assert( Value == GIA_ONE );
}